

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_rle_bp_encoder.hpp
# Opt level: O0

void __thiscall duckdb::RleBpEncoder::WriteCurrentBlockRLE(RleBpEncoder *this,WriteStream *writer)

{
  InternalException *this_00;
  long in_RDI;
  WriteStream *in_stack_ffffffffffffff98;
  uchar uVar1;
  WriteStream *in_stack_ffffffffffffffa0;
  allocator *paVar2;
  allocator local_31;
  string local_30 [48];
  
  ParquetDecodeUtils::VarintEncode<unsigned_long>
            ((unsigned_long)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  uVar1 = (uchar)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  switch(*(undefined4 *)(in_RDI + 4)) {
  case 1:
    WriteStream::Write<unsigned_char>(in_stack_ffffffffffffffa0,uVar1);
    break;
  case 2:
    WriteStream::Write<unsigned_short>
              (in_stack_ffffffffffffffa0,(unsigned_short)((ulong)in_stack_ffffffffffffff98 >> 0x30))
    ;
    break;
  case 3:
    WriteStream::Write<unsigned_char>(in_stack_ffffffffffffffa0,uVar1);
    uVar1 = (uchar)((ulong)in_stack_ffffffffffffff98 >> 0x38);
    WriteStream::Write<unsigned_char>(in_stack_ffffffffffffffa0,uVar1);
    WriteStream::Write<unsigned_char>(in_stack_ffffffffffffffa0,uVar1);
    break;
  case 4:
    WriteStream::Write<unsigned_int>
              (in_stack_ffffffffffffffa0,(uint)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    break;
  default:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    paVar2 = &local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"unsupported byte width for RLE encoding",paVar2);
    duckdb::InternalException::InternalException(this_00,local_30);
    __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
  }
  *(undefined8 *)(in_RDI + 0x10) = 0;
  return;
}

Assistant:

void WriteCurrentBlockRLE(WriteStream &writer) {
		ParquetDecodeUtils::VarintEncode(rle_count << 1 | 0, writer); // (... | 0) signals RLE run
		D_ASSERT(rle_value >> (byte_width * 8) == 0);
		switch (byte_width) {
		case 1:
			writer.Write<uint8_t>(rle_value);
			break;
		case 2:
			writer.Write<uint16_t>(rle_value);
			break;
		case 3:
			writer.Write<uint8_t>(rle_value & 0xFF);
			writer.Write<uint8_t>((rle_value >> 8) & 0xFF);
			writer.Write<uint8_t>((rle_value >> 16) & 0xFF);
			break;
		case 4:
			writer.Write<uint32_t>(rle_value);
			break;
		default:
			throw InternalException("unsupported byte width for RLE encoding");
		}
		rle_count = 0;
	}